

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O1

void __thiscall wasm::anon_unknown_18::Poppifier::poppify(Poppifier *this,Expression *expr)

{
  Expression **ppEVar1;
  pointer pTVar2;
  undefined1 auStack_108 [8];
  Poppifier poppifier;
  Expression *expr_local;
  
  auStack_108 = (undefined1  [8])0x0;
  poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
  super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.replacep = (Expression **)0x0;
  poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
  super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.fixed._M_elems[9].currp =
       (Expression **)0x0;
  poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
  super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task,_std::allocator<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
  super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task,_std::allocator<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
  super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task,_std::allocator<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
  super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task,_std::allocator<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
  super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.currFunction._0_1_ = 0;
  poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
  super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>._201_8_ = 0;
  poppifier._216_8_ = (this->builder).wasm;
  poppifier.builder.wasm = (Module *)expr;
  Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
            ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)auStack_108,
             wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
             scan(Poppifier*,wasm::Expression___,(Expression **)&poppifier.builder);
  if (((long)poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
             super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task,_std::allocator<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start -
       (long)poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
             super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.fixed._M_elems[9].currp
      >> 4) + (long)poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
                    super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.replacep != 0) {
    do {
      if ((pointer)poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
                   super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.fixed._M_elems[9].
                   currp ==
          poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
          super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task,_std::allocator<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
            super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.replacep == (Expression **)0x0)
        {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,
                        "T &wasm::SmallVector<wasm::Walker<Poppifier, wasm::Visitor<Poppifier>>::Task, 10>::back() [T = wasm::Walker<Poppifier, wasm::Visitor<Poppifier>>::Task, N = 10]"
                       );
        }
        pTVar2 = (pointer)&poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
                           super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.fixed.
                           _M_elems[(long)poppifier.
                                          super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>
                                          .super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
                                          replacep + -2].currp;
      }
      else {
        pTVar2 = poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
                 super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.flexible.
                 super__Vector_base<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task,_std::allocator<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      ppEVar1 = pTVar2->currp;
      if ((pointer)poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
                   super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.fixed._M_elems[9].
                   currp ==
          poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
          super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task,_std::allocator<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
            super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.replacep == (Expression **)0x0)
        {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x75,
                        "void wasm::SmallVector<wasm::Walker<Poppifier, wasm::Visitor<Poppifier>>::Task, 10>::pop_back() [T = wasm::Walker<Poppifier, wasm::Visitor<Poppifier>>::Task, N = 10]"
                       );
        }
        poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
        super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.replacep =
             (Expression **)
             ((long)poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
                    super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.replacep + -1);
      }
      else {
        poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
        super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task,_std::allocator<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
             super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task,_std::allocator<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      auStack_108 = (undefined1  [8])ppEVar1;
      if (*ppEVar1 == (Expression *)0x0) {
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x132,
                      "void wasm::Walker<Poppifier, wasm::Visitor<Poppifier>>::walk(Expression *&) [SubType = Poppifier, VisitorType = wasm::Visitor<Poppifier>]"
                     );
      }
      (*pTVar2->func)((Poppifier *)auStack_108,ppEVar1);
    } while (((long)poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
                    super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.flexible.
                    super__Vector_base<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task,_std::allocator<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
                    super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.fixed._M_elems[9]
                    .currp >> 4) +
             (long)poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
                   super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.replacep != 0);
  }
  if (poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
      super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.fixed._M_elems[9].currp !=
      (Expression **)0x0) {
    operator_delete(poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
                    super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.fixed._M_elems[9]
                    .currp,(long)poppifier.
                                 super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
                                 super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.
                                 flexible.
                                 super__Vector_base<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task,_std::allocator<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)poppifier.
                                 super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
                                 super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.
                                 fixed._M_elems[9].currp);
  }
  return;
}

Assistant:

void Poppifier::poppify(Expression* expr) {
  struct Poppifier : PostWalker<Poppifier> {
    bool scanned = false;
    Builder builder;
    Poppifier(Builder& builder) : builder(builder) {}

    static void scan(Poppifier* self, Expression** currp) {
      if (!self->scanned) {
        self->scanned = true;
        PostWalker<Poppifier>::scan(self, currp);
      } else {
        *currp = self->builder.makePop((*currp)->type);
      }
    }
  } poppifier(builder);
  poppifier.walk(expr);
}